

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

uint Extra_CountMintermsSimple(DdNode *bFunc,uint max)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (((ulong)bFunc & 1) == 0) {
    if (bFunc->index == 0x7fffffff) {
      if (s_Terminal == bFunc) {
        max = 0;
      }
    }
    else {
      uVar3 = (ulong)max * 0xc00005 + (long)bFunc;
      uVar3 = (ulong)(uint)(((int)uVar3 + (int)(uVar3 / 0x3b09) * -0x3b09) * 0x10);
      if ((*(DdNode **)((long)&HHTable2[0].Arg1 + uVar3) == bFunc) &&
         (*(uint *)((long)&HHTable2[0].Arg2 + uVar3) == max)) {
        max = *(uint *)((long)&HHTable2[0].Res + uVar3);
      }
      else {
        uVar1 = Extra_CountMintermsSimple((bFunc->type).kids.E,max);
        uVar2 = Extra_CountMintermsSimple((bFunc->type).kids.T,max);
        uVar1 = (uVar2 >> 1) + (uVar1 >> 1);
        *(DdNode **)((long)&HHTable2[0].Arg1 + uVar3) = bFunc;
        *(uint *)((long)&HHTable2[0].Arg2 + uVar3) = max;
        *(uint *)((long)&HHTable2[0].Res + uVar3) = uVar1;
        max = uVar1;
      }
    }
  }
  else {
    uVar1 = Extra_CountMintermsSimple((DdNode *)((ulong)bFunc & 0xfffffffffffffffe),max);
    max = max - uVar1;
  }
  return max;
}

Assistant:

unsigned Extra_CountMintermsSimple( DdNode * bFunc, unsigned max )
{
    unsigned HKey;

    // normalize
    if ( Cudd_IsComplement(bFunc) )
        return max - Extra_CountMintermsSimple( Cudd_Not(bFunc), max );

    // now it is known that the function is not complemented
    if ( cuddIsConstant(bFunc) )
        return ((bFunc==s_Terminal)? 0: max);

    // check cache
    HKey = hashKey2( bFunc, max, _TABLESIZE_MINT );
    if ( HHTable2[HKey].Arg1 == bFunc && HHTable2[HKey].Arg2 == max )
        return HHTable2[HKey].Res;
    else
    {
        // min = min0/2 + min1/2;
        unsigned min = (Extra_CountMintermsSimple( cuddE(bFunc), max ) >> 1) +
                       (Extra_CountMintermsSimple( cuddT(bFunc), max ) >> 1);

        HHTable2[HKey].Arg1 = bFunc;
        HHTable2[HKey].Arg2 = max;
        HHTable2[HKey].Res  = min;

        return min;
    }
}